

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luajit.c
# Opt level: O0

int dojitopt(lua_State *L,char *opt)

{
  int iVar1;
  char *opt_local;
  lua_State *L_local;
  
  lua_getfield(L,0xffffd8f0,"_LOADED");
  lua_getfield(L,0xffffffff,"jit.opt");
  lua_remove(L,0xfffffffe);
  lua_getfield(L,0xffffffff,"start");
  lua_remove(L,0xfffffffe);
  iVar1 = runcmdopt(L,opt);
  return iVar1;
}

Assistant:

static int dojitopt(lua_State *L, const char *opt)
{
  lua_getfield(L, LUA_REGISTRYINDEX, "_LOADED");
  lua_getfield(L, -1, "jit.opt");  /* Get jit.opt.* module table. */
  lua_remove(L, -2);
  lua_getfield(L, -1, "start");
  lua_remove(L, -2);
  return runcmdopt(L, opt);
}